

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GLES2ThreadTest::RenderTexture::RenderTexture
          (RenderTexture *this,SharedPtr<deqp::egl::GLES2ThreadTest::Program> *program,
          SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,bool useSync,bool serverSync)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_48;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_38;
  
  Operation::Operation(&this->super_Operation,"RenderTexture",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__RenderTexture_0215f188;
  (this->m_program).m_ptr = program->m_ptr;
  pSVar2 = program->m_state;
  (this->m_program).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_program).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  (this->m_texture).m_ptr = texture->m_ptr;
  pSVar2 = texture->m_state;
  (this->m_texture).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_texture).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  local_38.m_ptr = &program->m_ptr->super_Object;
  local_38.m_state = program->m_state;
  if (local_38.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_38.m_state)->strongRefCount = (local_38.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_38.m_state)->weakRefCount = (local_38.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::readGLObject(&this->super_Operation,&local_38);
  if (local_38.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_38.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_38.m_ptr = (Object *)0x0;
      (*(local_38.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_38.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_38.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_38.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_38.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  local_48.m_ptr = &texture->m_ptr->super_Object;
  local_48.m_state = texture->m_state;
  if (local_48.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_48.m_state)->strongRefCount = (local_48.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_48.m_state)->weakRefCount = (local_48.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::readGLObject(&this->super_Operation,&local_48);
  if (local_48.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_48.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_48.m_ptr = (Object *)0x0;
      (*(local_48.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_48.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_48.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_48.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

RenderTexture::RenderTexture (SharedPtr<Program> program, SharedPtr<Texture> texture, bool useSync, bool serverSync)
	: Operation	("RenderTexture", useSync, serverSync)
	, m_program	(program)
	, m_texture	(texture)
{
	readGLObject(SharedPtr<Object>(program));
	readGLObject(SharedPtr<Object>(texture));
}